

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status
aspa_table_src_replace
          (aspa_table *dst,aspa_table *src,rtr_socket *rtr_socket,_Bool notify_dst,_Bool notify_src)

{
  long lVar1;
  aspa_array *aspa_array;
  aspa_status aVar2;
  aspa_store_node **node;
  aspa_store_node **ppaVar3;
  aspa_record *paVar4;
  long in_FS_OFFSET;
  ulong local_70;
  size_t i_2;
  size_t i_1;
  size_t i;
  aspa_store_node **existing_dst_node;
  aspa_array *old_array;
  aspa_array *new_array;
  aspa_store_node **src_node;
  _Bool notify_src_local;
  _Bool notify_dst_local;
  rtr_socket *rtr_socket_local;
  aspa_table *src_local;
  aspa_table *dst_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((dst == (aspa_table *)0x0) || (src == (aspa_table *)0x0)) ||
      (rtr_socket == (rtr_socket *)0x0)) || (src == dst)) {
    dst_local._4_4_ = ASPA_ERROR;
  }
  else {
    pthread_rwlock_wrlock((pthread_rwlock_t *)&dst->update_lock);
    pthread_rwlock_wrlock((pthread_rwlock_t *)&src->update_lock);
    pthread_rwlock_wrlock((pthread_rwlock_t *)dst);
    pthread_rwlock_wrlock((pthread_rwlock_t *)src);
    node = aspa_store_get_node(&src->store,rtr_socket);
    if (((node == (aspa_store_node **)0x0) || (*node == (aspa_store_node *)0x0)) ||
       ((*node)->aspa_array == (aspa_array *)0x0)) {
      pthread_rwlock_unlock((pthread_rwlock_t *)src);
      pthread_rwlock_unlock((pthread_rwlock_t *)dst);
      pthread_rwlock_unlock((pthread_rwlock_t *)&src->update_lock);
      pthread_rwlock_unlock((pthread_rwlock_t *)&dst->update_lock);
      dst_local._4_4_ = ASPA_ERROR;
    }
    else {
      aspa_array = (*node)->aspa_array;
      existing_dst_node = (aspa_store_node **)0x0;
      ppaVar3 = aspa_store_get_node(&dst->store,rtr_socket);
      if ((ppaVar3 == (aspa_store_node **)0x0) || (*ppaVar3 == (aspa_store_node *)0x0)) {
        aVar2 = aspa_store_create_node(&dst->store,rtr_socket,aspa_array,(aspa_store_node ***)0x0);
        if (aVar2 != ASPA_SUCCESS) {
          pthread_rwlock_unlock((pthread_rwlock_t *)src);
          pthread_rwlock_unlock((pthread_rwlock_t *)dst);
          pthread_rwlock_unlock((pthread_rwlock_t *)&src->update_lock);
          pthread_rwlock_unlock((pthread_rwlock_t *)&dst->update_lock);
          dst_local._4_4_ = ASPA_ERROR;
          goto LAB_00108a06;
        }
      }
      else {
        existing_dst_node = (aspa_store_node **)(*ppaVar3)->aspa_array;
        (*ppaVar3)->aspa_array = aspa_array;
      }
      aspa_store_remove_node(node);
      pthread_rwlock_unlock((pthread_rwlock_t *)src);
      pthread_rwlock_unlock((pthread_rwlock_t *)dst);
      pthread_rwlock_unlock((pthread_rwlock_t *)&src->update_lock);
      pthread_rwlock_unlock((pthread_rwlock_t *)&dst->update_lock);
      if (notify_src) {
        for (i_1 = 0; i_1 < aspa_array->size; i_1 = i_1 + 1) {
          paVar4 = aspa_array_get_record(aspa_array,i_1);
          aspa_table_notify_clients(src,paVar4,rtr_socket,ASPA_REMOVE);
        }
      }
      if (existing_dst_node != (aspa_store_node **)0x0) {
        if (notify_dst) {
          for (i_2 = 0; i_2 < *(uint *)existing_dst_node; i_2 = i_2 + 1) {
            paVar4 = aspa_array_get_record((aspa_array *)existing_dst_node,i_2);
            aspa_table_notify_clients(dst,paVar4,rtr_socket,ASPA_REMOVE);
          }
        }
        aspa_array_free((aspa_array *)existing_dst_node,true);
      }
      if (notify_dst) {
        for (local_70 = 0; local_70 < aspa_array->size; local_70 = local_70 + 1) {
          paVar4 = aspa_array_get_record(aspa_array,local_70);
          aspa_table_notify_clients(dst,paVar4,rtr_socket,ASPA_ADD);
        }
      }
      dst_local._4_4_ = ASPA_SUCCESS;
    }
  }
LAB_00108a06:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return dst_local._4_4_;
}

Assistant:

enum aspa_status aspa_table_src_replace(struct aspa_table *dst, struct aspa_table *src, struct rtr_socket *rtr_socket,
					bool notify_dst, bool notify_src)
{
	if (!dst || !src || !rtr_socket || src == dst)
		return ASPA_ERROR;

	pthread_rwlock_wrlock(&dst->update_lock);
	pthread_rwlock_wrlock(&src->update_lock);
	pthread_rwlock_wrlock(&dst->lock);
	pthread_rwlock_wrlock(&src->lock);

	struct aspa_store_node **src_node = aspa_store_get_node(&src->store, rtr_socket);

	if (!src_node || !*src_node || !(*src_node)->aspa_array) {
		pthread_rwlock_unlock(&src->lock);
		pthread_rwlock_unlock(&dst->lock);
		pthread_rwlock_unlock(&src->update_lock);
		pthread_rwlock_unlock(&dst->update_lock);
		return ASPA_ERROR;
	}

	struct aspa_array *new_array = (*src_node)->aspa_array;
	struct aspa_array *old_array = NULL;

	// Try to get an existing node in the source table's store
	struct aspa_store_node **existing_dst_node = aspa_store_get_node(&dst->store, rtr_socket);

	if (existing_dst_node && *existing_dst_node) {
		// Swap array
		old_array = (*existing_dst_node)->aspa_array;
		(*existing_dst_node)->aspa_array = new_array;
	} else {
		// There's no old_array.
		// Destination table hasn't got an existing store node for the socket, so create a new one
		if (aspa_store_create_node(&dst->store, rtr_socket, new_array, NULL) != ASPA_SUCCESS) {
			pthread_rwlock_unlock(&src->lock);
			pthread_rwlock_unlock(&dst->lock);
			pthread_rwlock_unlock(&src->update_lock);
			pthread_rwlock_unlock(&dst->update_lock);
			return ASPA_ERROR;
		}
	}

	// Remove socket from source table's store
	aspa_store_remove_node(src_node);
	pthread_rwlock_unlock(&src->lock);
	pthread_rwlock_unlock(&dst->lock);
	pthread_rwlock_unlock(&src->update_lock);
	pthread_rwlock_unlock(&dst->update_lock);

	if (notify_src)
		// Notify src clients their records are being removed
		for (size_t i = 0; i < new_array->size; i++)
			aspa_table_notify_clients(src, aspa_array_get_record(new_array, i), rtr_socket, ASPA_REMOVE);

	if (old_array) {
		if (notify_dst)
			// Notify dst clients of their existing records are being removed
			for (size_t i = 0; i < old_array->size; i++)
				aspa_table_notify_clients(dst, aspa_array_get_record(old_array, i), rtr_socket,
							  ASPA_REMOVE);

		// Free the old array and their provider sets
		aspa_array_free(old_array, true);
	}

	if (notify_dst)
		// Notify dst clients the records from src are added
		for (size_t i = 0; i < new_array->size; i++)
			aspa_table_notify_clients(dst, aspa_array_get_record(new_array, i), rtr_socket, ASPA_ADD);

	return ASPA_SUCCESS;
}